

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_16.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
read_numbers(vector<double,_std::allocator<double>_> *__return_storage_ptr__,string *fname)

{
  byte bVar1;
  bool bVar2;
  long *plVar3;
  string local_258 [32];
  double local_238;
  double num;
  long local_220;
  ifstream file;
  string *fname_local;
  vector<double,_std::allocator<double>_> *numbers;
  
  std::ifstream::ifstream(&local_220,fname,8);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) != 0) {
    file_open_err(fname,in);
  }
  num._3_1_ = 0;
  memset(__return_storage_ptr__,0,0x18);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  local_238 = 0.0;
  while( true ) {
    plVar3 = (long *)std::istream::operator>>((istream *)&local_220,&local_238);
    bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
    if (!bVar2) break;
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&local_238);
  }
  bVar1 = std::ios::bad();
  if ((((bVar1 & 1) != 0) || (bVar1 = std::ios::fail(), (bVar1 & 1) != 0)) &&
     (bVar1 = std::ios::eof(), (bVar1 & 1) == 0)) {
    std::operator+((char *)local_258,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Failed to read data from file ");
    error(local_258);
    std::__cxx11::string::~string((string *)local_258);
  }
  num._3_1_ = 1;
  std::ifstream::~ifstream(&local_220);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> read_numbers(const std::string& fname)
{
	auto file = std::ifstream{ fname };
	if (!file)
	{
		file_open_err(fname, FileType::in);
	}
	auto numbers = std::vector<double>();
	for (auto num = 0.0; file >> num;)
	{
		numbers.push_back(num);
	}
	if ((file.bad() || file.fail()) && !file.eof())
	{
		error("Failed to read data from file " + fname);
	}
	return numbers;
}